

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase725::run(TestCase725 *this)

{
  byte *pbVar1;
  Server *pSVar2;
  TestNetworkAdapter *pTVar3;
  Event **ppEVar4;
  TaskSet *pTVar5;
  undefined8 uVar6;
  long *plVar7;
  WirePointer *pWVar8;
  CapTableReader *pCVar9;
  PromiseNode *pPVar10;
  PromiseFulfiller<void> *pPVar11;
  int iVar12;
  TransformPromiseNodeBase *pTVar13;
  socklen_t in_ECX;
  char *pcVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *pvVar17;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int in_R8D;
  _Base_ptr p_Var18;
  bool bVar19;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar20;
  Own<capnp::ClientHook> OVar21;
  Reader RVar22;
  bool destroyed;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request_1;
  Client client;
  Client capCopy;
  uint oldSentCount;
  Promise<void> destructionPromise;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  request;
  PromiseFulfillerPair<void> paf;
  TestContext context;
  char local_549;
  undefined1 local_548 [8];
  undefined8 uStack_540;
  TestNetworkAdapter *local_538;
  TestNetworkAdapter *local_530;
  Event **local_528;
  _Base_ptr p_Stack_520;
  TaskSet *local_518;
  undefined1 local_510 [16];
  long *local_500;
  WirePointer *local_4f8;
  _Base_ptr local_4f0;
  _Base_ptr p_Stack_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8 [16];
  long *plStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 local_4b8;
  _Base_ptr p_Stack_4b0;
  PointerReader local_4a8;
  uint local_484;
  undefined1 local_480 [16];
  ExceptionOrValue local_470;
  char local_310;
  Own<kj::_::PromiseNode> local_308;
  Own<kj::PromiseFulfiller<void>_> local_2f8;
  ArrayPtr<const_char> local_2e8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_2d8 [3];
  undefined8 *local_2a8;
  long *local_2a0;
  Maybe<capnp::MessageSize> local_298;
  Maybe<capnp::MessageSize> local_280;
  Maybe<capnp::MessageSize> local_268;
  Maybe<capnp::MessageSize> local_250;
  Maybe<capnp::MessageSize> local_238;
  Maybe<capnp::MessageSize> local_220;
  Maybe<capnp::MessageSize> local_208;
  Maybe<capnp::MessageSize> local_1f0;
  Maybe<capnp::MessageSize> local_1d8;
  Maybe<capnp::MessageSize> local_1c0;
  Maybe<capnp::MessageSize> local_1a8;
  Maybe<capnp::MessageSize> local_190;
  Maybe<capnp::MessageSize> local_178;
  Maybe<capnp::MessageSize> local_160;
  TestContext local_148;
  
  TestContext::TestContext(&local_148);
  kj::newPromiseAndFulfiller<void>();
  local_549 = '\0';
  pTVar13 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar13,&local_308,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:730:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar13->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631b60;
  pTVar13[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_549;
  local_548 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase725::run()::$_0,kj::_::PropagateException>>
               ::instance;
  uStack_540 = (_Base_ptr)pTVar13;
  OVar20 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_470,(Own<kj::_::PromiseNode> *)local_548);
  pTVar13 = (TransformPromiseNodeBase *)uStack_540;
  local_480._0_4_ = local_470.exception.ptr._0_4_;
  local_480._4_4_ = local_470.exception.ptr._4_4_;
  local_480._12_4_ = local_470.exception.ptr.field_1._4_4_;
  local_480._8_4_ = local_470.exception.ptr.field_1._0_4_;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,
               (pTVar13->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar13->super_PromiseNode)._vptr_PromiseNode,OVar20.ptr);
  }
  TestContext::connect((TestContext *)local_548,(int)&local_148,(sockaddr *)0x5,in_ECX);
  (*(((TransformPromiseNodeBase *)uStack_540)->super_PromiseNode)._vptr_PromiseNode[4])(&local_470);
  pTVar13 = (TransformPromiseNodeBase *)uStack_540;
  local_4d8._8_4_ = local_470.exception.ptr._0_4_;
  local_4d8._12_4_ = local_470.exception.ptr._4_4_;
  plStack_4c8 = (long *)CONCAT44(local_470.exception.ptr.field_1._4_4_,
                                 local_470.exception.ptr.field_1._0_4_);
  local_4d8._0_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,
               (pTVar13->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar13->super_PromiseNode)._vptr_PromiseNode);
  }
  local_160.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)&local_470,(Client *)local_4d8,&local_160);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_4a8,&local_2f8);
  pcVar14 = (char *)local_4a8.capTable;
  local_548 = (undefined1  [8])local_4a8.segment;
  uStack_540 = (_Base_ptr)((long)local_4a8.capTable + 0x40);
  if ((_Base_ptr)local_4a8.capTable == (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
  }
  local_4a8.capTable = (CapTableReader *)0x0;
  OVar21 = Capability::Client::makeLocalClient
                     ((Client *)(local_510 + 8),(Own<capnp::Capability::Server> *)local_548);
  p_Var15 = uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,(*(_func_int ***)p_Var15)[-2] + (long)&p_Var15->_M_color,OVar21.ptr);
  }
  local_510._0_8_ = &Capability::Client::typeinfo;
  local_548 = (undefined1  [8])CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_)
  ;
  uStack_540 = (_Base_ptr)
               CONCAT44(local_470.exception.ptr.field_1._4_4_,local_470.exception.ptr.field_1._0_4_)
  ;
  local_538 = (TestNetworkAdapter *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_548,(Own<capnp::ClientHook> *)(local_510 + 8));
  plVar7 = local_500;
  pvVar17 = extraout_RDX;
  if (local_500 != (long *)0x0) {
    local_500 = (long *)0x0;
    (**((CapTableReader *)local_510._8_8_)->_vptr_CapTableReader)
              (local_510._8_8_,*(long *)(*plVar7 + -0x10) + (long)plVar7);
    pvVar17 = extraout_RDX_00;
  }
  pCVar9 = local_4a8.capTable;
  if (local_4a8.capTable != (CapTableReader *)0x0) {
    local_4a8.capTable = (CapTableReader *)0x0;
    (*(code *)((SegmentReader *)&(local_4a8.segment)->arena)->arena->_vptr_Arena)
              (local_4a8.segment,
               pCVar9->_vptr_CapTableReader[-2] + (long)&pCVar9->_vptr_CapTableReader);
    pvVar17 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)local_548,(int)&local_470,pvVar17,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_2d8,local_548);
  plVar7 = local_2a0;
  if (local_2a0 != (long *)0x0) {
    local_2a0 = (long *)0x0;
    (**(code **)*local_2a8)(local_2a8,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  uVar6 = local_470.exception.ptr.field_1.value.description.content.ptr;
  if ((Disposer *)local_470.exception.ptr.field_1.value.description.content.ptr != (Disposer *)0x0)
  {
    local_470.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_470.exception.ptr.field_1.value.type,
                         local_470.exception.ptr.field_1.value.line))
              ((undefined8 *)
               CONCAT44(local_470.exception.ptr.field_1.value.type,
                        local_470.exception.ptr.field_1.value.line),
               (char *)(uVar6 + (long)(*(_func_int ***)uVar6)[-2]));
  }
  local_178.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_510,
             (Client *)
             (&((Client *)local_4d8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_178);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_548,(int)local_510,__buf,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_ != 1;
  }
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var15 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4a8.segment = (SegmentReader *)CONCAT44(local_4a8.segment._4_4_,1);
    local_190.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_510,
               (Client *)
               (&((Client *)local_4d8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_190);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_548,(int)local_510,__buf_00,(size_t)pcVar14,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
    local_4c0._0_4_ = 0;
    if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
      local_4c0._0_4_ = *(undefined4 *)local_470.exception.ptr.field_1.value.ownFile.content.size_;
    }
    pcVar14 = 
    "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f9687;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2e7,ERROR,
               "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4a8,(uint *)local_4c0);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var15 = p_Stack_520;
    ppEVar4 = local_528;
    if (local_528 != (Event **)0x0) {
      local_528 = (Event **)0x0;
      p_Stack_520 = (_Base_ptr)0x0;
      p_Var16 = p_Var15;
      (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
      in_R8D = (int)p_Var16;
      pcVar14 = (char *)p_Var15;
    }
    pTVar3 = local_530;
    if (local_530 != (TestNetworkAdapter *)0x0) {
      local_530 = (TestNetworkAdapter *)0x0;
      (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
                (local_538,
                 (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pSVar2 = (Server *)uStack_540;
    if (uStack_540 != (_Base_ptr)0x0) {
      uStack_540 = (_Base_ptr)0x0;
      (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
                (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
    }
    p_Var15 = local_4e0;
    if (local_4e0 != (_Base_ptr)0x0) {
      local_4e0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4e8)
                (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
    }
  }
  if ((local_549 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    pcVar14 = "\"failed: expected \" \"!(destroyed)\"";
    in_R8D = 0x4c9e34;
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ea,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  local_1a8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)local_510,(Client *)local_4d8,&local_1a8);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_548,(int)local_510,__buf_01,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)&local_470,local_548);
  if (local_470.exception.ptr.field_1._28_2_ == 0) {
    local_4a8.nestingLimit = 0x7fffffff;
    pcVar14 = (char *)0x0;
    local_4a8.pointer = (WirePointer *)0x0;
    local_4a8.segment = (SegmentReader *)0x0;
  }
  else {
    local_4a8.segment =
         (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
    pcVar14 = (char *)CONCAT44(local_470.exception.ptr.field_1._4_4_,
                               local_470.exception.ptr.field_1._0_4_);
    local_4a8.pointer =
         (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
  }
  local_4a8.capTable = (CapTableReader *)pcVar14;
  RVar22 = PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0);
  bVar19 = true;
  if (RVar22.super_StringPtr.content.size_ == 4) {
    iVar12 = bcmp(RVar22.super_StringPtr.content.ptr,"bar",3);
    bVar19 = iVar12 != 0;
  }
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var15 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_1c0.ptr.isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
              ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
                *)local_510,(Client *)local_4d8,&local_1c0);
    Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
            *)local_548,(int)local_510,__buf_02,(size_t)pcVar14,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
                *)&local_470,local_548);
    if (local_470.exception.ptr.field_1._28_2_ == 0) {
      local_4a8.nestingLimit = 0x7fffffff;
      local_4a8.capTable = (CapTableReader *)0x0;
      local_4a8.pointer = (WirePointer *)0x0;
      local_4a8.segment = (SegmentReader *)0x0;
    }
    else {
      local_4a8.segment =
           (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
      local_4a8.capTable =
           (CapTableReader *)
           CONCAT44(local_470.exception.ptr.field_1._4_4_,local_470.exception.ptr.field_1._0_4_);
      local_4a8.pointer =
           (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
      local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
    }
    _local_4c0 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0)
    ;
    pcVar14 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4f9792;
    kj::_::Debug::log<char_const(&)[93],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ed,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
               ,(char (*) [93])
                "failed: expected (\"bar\") == (client.callHeldRequest().send().wait(context.waitScope).getS())"
               ,(char (*) [4])0x502717,(Reader *)local_4c0);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var15 = p_Stack_520;
    ppEVar4 = local_528;
    if (local_528 != (Event **)0x0) {
      local_528 = (Event **)0x0;
      p_Stack_520 = (_Base_ptr)0x0;
      p_Var16 = p_Var15;
      (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
      in_R8D = (int)p_Var16;
      pcVar14 = (char *)p_Var15;
    }
    pTVar3 = local_530;
    if (local_530 != (TestNetworkAdapter *)0x0) {
      local_530 = (TestNetworkAdapter *)0x0;
      (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
                (local_538,
                 (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pSVar2 = (Server *)uStack_540;
    if (uStack_540 != (_Base_ptr)0x0) {
      uStack_540 = (_Base_ptr)0x0;
      (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
                (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
    }
    p_Var15 = local_4e0;
    if (local_4e0 != (_Base_ptr)0x0) {
      local_4e0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4e8)
                (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
    }
  }
  local_1d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
              *)local_510,(Client *)local_4d8,&local_1d8);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
          *)local_548,(int)local_510,__buf_03,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>
              *)&local_470,local_548);
  if (local_470.exception.ptr.field_1._28_2_ == 0) {
    local_4a8.nestingLimit = 0x7fffffff;
    p_Var15 = (_Base_ptr)0x0;
    local_4a8.pointer = (WirePointer *)0x0;
    local_4a8.segment = (SegmentReader *)0x0;
  }
  else {
    local_4a8.segment =
         (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
    p_Var15 = (_Base_ptr)
              CONCAT44(local_470.exception.ptr.field_1._4_4_,local_470.exception.ptr.field_1._0_4_);
    local_4a8.pointer =
         (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
  }
  local_4a8.capTable = (CapTableReader *)p_Var15;
  OVar21 = PointerReader::getCapability((PointerReader *)&local_2e8);
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  local_4b8._0_4_ = local_2e8.ptr._0_4_;
  local_4b8._4_4_ = local_2e8.ptr._4_4_;
  p_Stack_4b0 = (_Base_ptr)local_2e8.size_;
  local_4c0 = (undefined1  [8])&Capability::Client::typeinfo;
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10),OVar21.ptr);
  }
  p_Var16 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var15 = p_Var16;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var15;
    p_Var15 = p_Var16;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var16 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var16 + -0x10) + (long)&p_Var16->_M_color);
  }
  local_484 = (local_148.clientNetwork)->sent;
  local_1f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_548,(Client *)local_4c0,&local_1f0);
  *(undefined4 *)
   &(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase = 0x7b;
  pbVar1 = (byte *)((long)&(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase.
                           _vptr_VatNetworkBase + 4);
  *pbVar1 = *pbVar1 | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_510,(int)local_548,__buf_04,(size_t)p_Var15,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_470,local_510);
  if (local_470.exception.ptr.field_1._28_2_ == 0) {
    local_4a8.nestingLimit = 0x7fffffff;
    pcVar14 = (char *)0x0;
    local_4a8.pointer = (WirePointer *)0x0;
    local_4a8.segment = (SegmentReader *)0x0;
  }
  else {
    local_4a8.segment =
         (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
    pcVar14 = (char *)CONCAT44(local_470.exception.ptr.field_1._4_4_,
                               local_470.exception.ptr.field_1._0_4_);
    local_4a8.pointer =
         (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
  }
  local_4a8.capTable = (CapTableReader *)pcVar14;
  RVar22 = PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0);
  pvVar17 = RVar22.super_StringPtr.content.size_;
  bVar19 = true;
  if (pvVar17 == (void *)0x4) {
    iVar12 = bcmp(RVar22.super_StringPtr.content.ptr,"foo",3);
    bVar19 = iVar12 != 0;
    pvVar17 = extraout_RDX_02;
  }
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    pvVar17 = extraout_RDX_03;
  }
  p_Var16 = p_Stack_4e8;
  p_Var15 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    p_Stack_4e8 = (_Base_ptr)0x0;
    p_Var18 = p_Var16;
    (*(code *)**(undefined8 **)local_4e0)(local_4e0,p_Var15,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var18;
    pcVar14 = (char *)p_Var16;
    pvVar17 = extraout_RDX_04;
  }
  pWVar8 = local_4f8;
  if (local_4f8 != (WirePointer *)0x0) {
    local_4f8 = (WirePointer *)0x0;
    (**(code **)*local_500)
              (local_500,(long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
    pvVar17 = extraout_RDX_05;
  }
  uVar6 = local_510._8_8_;
  if ((ClientHook *)local_510._8_8_ != (ClientHook *)0x0) {
    local_510._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_510._0_8_)
              (local_510._0_8_,
               ((CapTableReader *)uVar6)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar6);
    pvVar17 = extraout_RDX_06;
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
    ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
            *)local_510,(int)local_548,pvVar17,(size_t)pcVar14,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
               &local_470,local_510);
    if (local_470.exception.ptr.field_1._28_2_ == 0) {
      local_4a8.nestingLimit = 0x7fffffff;
      local_4a8.capTable = (CapTableReader *)0x0;
      local_4a8.pointer = (WirePointer *)0x0;
      local_4a8.segment = (SegmentReader *)0x0;
    }
    else {
      local_4a8.segment =
           (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
      local_4a8.capTable =
           (CapTableReader *)
           CONCAT44(local_470.exception.ptr.field_1._4_4_,local_470.exception.ptr.field_1._0_4_);
      local_4a8.pointer =
           (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
      local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
    }
    local_2e8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0);
    pcVar14 = 
    "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
    ;
    in_R8D = 0x4f9878;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
               ,(char (*) [76])
                "failed: expected (\"foo\") == (request.send().wait(context.waitScope).getX())",
               (char (*) [4])0x4fa6a4,(Reader *)&local_2e8);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var16 = p_Stack_4e8;
    p_Var15 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      p_Stack_4e8 = (_Base_ptr)0x0;
      p_Var18 = p_Var16;
      (*(code *)**(undefined8 **)local_4e0)(local_4e0,p_Var15,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var18;
      pcVar14 = (char *)p_Var16;
    }
    pWVar8 = local_4f8;
    if (local_4f8 != (WirePointer *)0x0) {
      local_4f8 = (WirePointer *)0x0;
      (**(code **)*local_500)
                (local_500,(long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
    }
    uVar6 = local_510._8_8_;
    if ((ClientHook *)local_510._8_8_ != (ClientHook *)0x0) {
      local_510._8_8_ = (ClientHook *)0x0;
      (**(code **)*(EventPort **)local_510._0_8_)
                (local_510._0_8_,
                 ((CapTableReader *)uVar6)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar6
                );
    }
  }
  if ((local_484 != (local_148.clientNetwork)->sent) && (kj::_::Debug::minSeverity < 3)) {
    pcVar14 = 
    "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
    ;
    in_R8D = 0x4f9947;
    local_470.exception.ptr._0_4_ = (local_148.clientNetwork)->sent;
    kj::_::Debug::log<char_const(&)[74],unsigned_int&,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
               ,(char (*) [74])
                "failed: expected (oldSentCount) == (context.clientNetwork.getSentCount())",
               &local_484,(uint *)&local_470);
  }
  pTVar5 = local_518;
  if (local_518 != (TaskSet *)0x0) {
    local_518 = (TaskSet *)0x0;
    (***(_func_int ***)p_Stack_520)
              (p_Stack_520,
               (long)pTVar5->errorHandler[-2]._vptr_ErrorHandler + (long)&pTVar5->errorHandler);
  }
  local_208.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callFooRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
              *)local_548,(Client *)local_4d8,&local_208);
  local_470.exception.ptr._0_4_ = local_548._0_4_;
  local_470.exception.ptr._4_4_ = local_548._4_4_;
  local_470.exception.ptr.field_1._0_4_ = (int)uStack_540;
  local_470.exception.ptr.field_1._4_4_ = uStack_540._4_4_;
  local_470.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_530;
  (**(code **)(**(long **)(local_4c0 + 8 + (long)((_Base_ptr)((long)local_4c0 + -0x20))->_M_parent)
              + 0x20))(local_510);
  PointerBuilder::setCapability((PointerBuilder *)&local_470,(Own<capnp::ClientHook> *)local_510);
  uVar6 = local_510._8_8_;
  pvVar17 = extraout_RDX_07;
  if ((ClientHook *)local_510._8_8_ != (ClientHook *)0x0) {
    local_510._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_510._0_8_)
              (local_510._0_8_,
               ((CapTableReader *)uVar6)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar6);
    pvVar17 = extraout_RDX_08;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
          *)local_510,(int)local_548,pvVar17,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
              *)&local_470,local_510);
  if (local_470.exception.ptr.field_1._28_2_ == 0) {
    local_4a8.nestingLimit = 0x7fffffff;
    pcVar14 = (char *)0x0;
    local_4a8.pointer = (WirePointer *)0x0;
    local_4a8.segment = (SegmentReader *)0x0;
  }
  else {
    local_4a8.segment =
         (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
    pcVar14 = (char *)CONCAT44(local_470.exception.ptr.field_1._4_4_,
                               local_470.exception.ptr.field_1._0_4_);
    local_4a8.pointer =
         (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
  }
  local_4a8.capTable = (CapTableReader *)pcVar14;
  RVar22 = PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0);
  pvVar17 = RVar22.super_StringPtr.content.size_;
  bVar19 = true;
  if (pvVar17 == (void *)0x4) {
    iVar12 = bcmp(RVar22.super_StringPtr.content.ptr,"bar",3);
    bVar19 = iVar12 != 0;
    pvVar17 = extraout_RDX_09;
  }
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    pvVar17 = extraout_RDX_10;
  }
  p_Var16 = p_Stack_4e8;
  p_Var15 = local_4f0;
  if (local_4f0 != (_Base_ptr)0x0) {
    local_4f0 = (_Base_ptr)0x0;
    p_Stack_4e8 = (_Base_ptr)0x0;
    p_Var18 = p_Var16;
    (*(code *)**(undefined8 **)local_4e0)(local_4e0,p_Var15,8,p_Var16,p_Var16,0);
    in_R8D = (int)p_Var18;
    pcVar14 = (char *)p_Var16;
    pvVar17 = extraout_RDX_11;
  }
  pWVar8 = local_4f8;
  if (local_4f8 != (WirePointer *)0x0) {
    local_4f8 = (WirePointer *)0x0;
    (**(code **)*local_500)
              (local_500,(long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
    pvVar17 = extraout_RDX_12;
  }
  uVar6 = local_510._8_8_;
  if ((ClientHook *)local_510._8_8_ != (ClientHook *)0x0) {
    local_510._8_8_ = (ClientHook *)0x0;
    (**(code **)*(EventPort **)local_510._0_8_)
              (local_510._0_8_,
               ((CapTableReader *)uVar6)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar6);
    pvVar17 = extraout_RDX_13;
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
            *)local_510,(int)local_548,pvVar17,(size_t)pcVar14,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
                *)&local_470,local_510);
    if (local_470.exception.ptr.field_1._28_2_ == 0) {
      local_470.exception.ptr.field_1.value.line = 0x7fffffff;
      local_4a8.capTable = (CapTableReader *)0x0;
      local_470.exception.ptr.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)(TestNetworkAdapter *)0x0;
      local_4a8.segment = (SegmentReader *)0x0;
    }
    else {
      local_4a8.segment =
           (SegmentReader *)CONCAT44(local_470.exception.ptr._4_4_,local_470.exception.ptr._0_4_);
      local_4a8.capTable =
           (CapTableReader *)
           CONCAT44(local_470.exception.ptr.field_1._4_4_,local_470.exception.ptr.field_1._0_4_);
    }
    local_4a8.pointer =
         (WirePointer *)local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4a8.nestingLimit = local_470.exception.ptr.field_1.value.line;
    local_2e8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_4a8,(void *)0x0,0);
    pcVar14 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4f9a1a;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
               ,(char (*) [76])
                "failed: expected (\"bar\") == (request.send().wait(context.waitScope).getS())",
               (char (*) [4])0x502717,(Reader *)&local_2e8);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var16 = p_Stack_4e8;
    p_Var15 = local_4f0;
    if (local_4f0 != (_Base_ptr)0x0) {
      local_4f0 = (_Base_ptr)0x0;
      p_Stack_4e8 = (_Base_ptr)0x0;
      p_Var18 = p_Var16;
      (*(code *)**(undefined8 **)local_4e0)(local_4e0,p_Var15,8,p_Var16,p_Var16,0);
      in_R8D = (int)p_Var18;
      pcVar14 = (char *)p_Var16;
    }
    pWVar8 = local_4f8;
    if (local_4f8 != (WirePointer *)0x0) {
      local_4f8 = (WirePointer *)0x0;
      (**(code **)*local_500)
                (local_500,(long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
    }
    uVar6 = local_510._8_8_;
    if ((ClientHook *)local_510._8_8_ != (ClientHook *)0x0) {
      local_510._8_8_ = (ClientHook *)0x0;
      (**(code **)*(EventPort **)local_510._0_8_)
                (local_510._0_8_,
                 ((CapTableReader *)uVar6)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar6
                );
    }
  }
  pTVar5 = local_518;
  if (local_518 != (TaskSet *)0x0) {
    local_518 = (TaskSet *)0x0;
    (***(_func_int ***)p_Stack_520)
              (p_Stack_520,
               (long)pTVar5->errorHandler[-2]._vptr_ErrorHandler + (long)&pTVar5->errorHandler);
  }
  p_Var15 = p_Stack_4b0;
  if (p_Stack_4b0 != (_Base_ptr)0x0) {
    p_Stack_4b0 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)local_4b8)
              (local_4b8,(long)&p_Var15->_M_color + *(long *)(*(long *)p_Var15 + -0x10));
  }
  local_220.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_510,
             (Client *)
             (&((Client *)local_4d8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_220);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_548,(int)local_510,__buf_05,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_ != 5;
  }
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var15 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4a8.segment = (SegmentReader *)CONCAT44(local_4a8.segment._4_4_,5);
    local_238.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_510,
               (Client *)
               (&((Client *)local_4d8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_238);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_548,(int)local_510,__buf_06,(size_t)pcVar14,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
    iVar12 = 0;
    if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
      iVar12 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4c0._0_4_ = iVar12;
    pcVar14 = 
    "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f9b15;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x306,ERROR,
               "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4a8,(uint *)local_4c0);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var15 = p_Stack_520;
    ppEVar4 = local_528;
    if (local_528 != (Event **)0x0) {
      local_528 = (Event **)0x0;
      p_Stack_520 = (_Base_ptr)0x0;
      p_Var16 = p_Var15;
      (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
      in_R8D = (int)p_Var16;
      pcVar14 = (char *)p_Var15;
    }
    pTVar3 = local_530;
    if (local_530 != (TestNetworkAdapter *)0x0) {
      local_530 = (TestNetworkAdapter *)0x0;
      (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
                (local_538,
                 (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pSVar2 = (Server *)uStack_540;
    if (uStack_540 != (_Base_ptr)0x0) {
      uStack_540 = (_Base_ptr)0x0;
      (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
                (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
    }
    p_Var15 = local_4e0;
    if (local_4e0 != (_Base_ptr)0x0) {
      local_4e0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4e8)
                (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
    }
  }
  local_250.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_510,
             (Client *)
             (&((Client *)local_4d8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_250);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_548,(int)local_510,__buf_07,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_ != 6;
  }
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var15 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4a8.segment = (SegmentReader *)CONCAT44(local_4a8.segment._4_4_,6);
    local_268.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_510,
               (Client *)
               (&((Client *)local_4d8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_268);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_548,(int)local_510,__buf_08,(size_t)pcVar14,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
    iVar12 = 0;
    if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
      iVar12 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4c0._0_4_ = iVar12;
    pcVar14 = 
    "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f9c24;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x307,ERROR,
               "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4a8,(uint *)local_4c0);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var15 = p_Stack_520;
    ppEVar4 = local_528;
    if (local_528 != (Event **)0x0) {
      local_528 = (Event **)0x0;
      p_Stack_520 = (_Base_ptr)0x0;
      p_Var16 = p_Var15;
      (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
      in_R8D = (int)p_Var16;
      pcVar14 = (char *)p_Var15;
    }
    pTVar3 = local_530;
    if (local_530 != (TestNetworkAdapter *)0x0) {
      local_530 = (TestNetworkAdapter *)0x0;
      (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
                (local_538,
                 (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pSVar2 = (Server *)uStack_540;
    if (uStack_540 != (_Base_ptr)0x0) {
      uStack_540 = (_Base_ptr)0x0;
      (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
                (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
    }
    p_Var15 = local_4e0;
    if (local_4e0 != (_Base_ptr)0x0) {
      local_4e0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4e8)
                (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
    }
  }
  local_280.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_510,
             (Client *)
             (&((Client *)local_4d8)->field_0x0 +
             (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_280);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_548,(int)local_510,__buf_09,(size_t)pcVar14,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  bVar19 = true;
  if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
    bVar19 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_ != 7;
  }
  if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
              (local_470.exception.ptr.field_1.value.description.content.ptr,
               uVar6 + *(long *)(*(long *)uVar6 + -0x10));
  }
  p_Var15 = p_Stack_520;
  ppEVar4 = local_528;
  if (local_528 != (Event **)0x0) {
    local_528 = (Event **)0x0;
    p_Stack_520 = (_Base_ptr)0x0;
    p_Var16 = p_Var15;
    (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    in_R8D = (int)p_Var16;
    pcVar14 = (char *)p_Var15;
  }
  pTVar3 = local_530;
  if (local_530 != (TestNetworkAdapter *)0x0) {
    local_530 = (TestNetworkAdapter *)0x0;
    (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (local_538,
               (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                      _vptr_VatNetworkBase +
               (long)((Event *)
                     (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                     _vptr_VatNetworkBase)[-1].prev);
  }
  pSVar2 = (Server *)uStack_540;
  if (uStack_540 != (_Base_ptr)0x0) {
    uStack_540 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
              (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
  }
  p_Var15 = local_4e0;
  if (local_4e0 != (_Base_ptr)0x0) {
    local_4e0 = (_Base_ptr)0x0;
    (***(_func_int ***)p_Stack_4e8)
              (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
  }
  if ((bool)(bVar19 & kj::_::Debug::minSeverity < 3)) {
    local_4a8.segment = (SegmentReader *)CONCAT44(local_4a8.segment._4_4_,7);
    local_298.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                *)local_510,
               (Client *)
               (&((Client *)local_4d8)->field_0x0 +
               (long)*(pointer_____offset_0x10___ *)(local_4d8._0_8_ + -0x20)),&local_298);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)local_548,(int)local_510,__buf_10,(size_t)pcVar14,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_470,local_548);
    iVar12 = 0;
    if (0x1f < (uint)local_470.exception.ptr.field_1._24_4_) {
      iVar12 = *(int *)local_470.exception.ptr.field_1.value.ownFile.content.size_;
    }
    local_4c0._0_4_ = iVar12;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x308,ERROR,
               "\"failed: expected \" \"(7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 7, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&local_4a8,(uint *)local_4c0);
    uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
    if ((Impl *)local_470.exception.ptr.field_1.value.description.content.size_ != (Impl *)0x0) {
      local_470.exception.ptr.field_1.value.description.content.size_ = 0;
      (***(_func_int ***)local_470.exception.ptr.field_1.value.description.content.ptr)
                (local_470.exception.ptr.field_1.value.description.content.ptr,
                 uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    p_Var15 = p_Stack_520;
    ppEVar4 = local_528;
    if (local_528 != (Event **)0x0) {
      local_528 = (Event **)0x0;
      p_Stack_520 = (_Base_ptr)0x0;
      (*(code *)local_518->errorHandler->_vptr_ErrorHandler)(local_518,ppEVar4,8,p_Var15,p_Var15,0);
    }
    pTVar3 = local_530;
    if (local_530 != (TestNetworkAdapter *)0x0) {
      local_530 = (TestNetworkAdapter *)0x0;
      (**(local_538->super_TestNetworkAdapterBase).super_VatNetworkBase._vptr_VatNetworkBase)
                (local_538,
                 (long)&(pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                        _vptr_VatNetworkBase +
                 (long)((Event *)
                       (pTVar3->super_TestNetworkAdapterBase).super_VatNetworkBase.
                       _vptr_VatNetworkBase)[-1].prev);
    }
    pSVar2 = (Server *)uStack_540;
    if (uStack_540 != (_Base_ptr)0x0) {
      uStack_540 = (_Base_ptr)0x0;
      (*(code *)((SegmentReader *)local_548)->arena->_vptr_Arena)
                (local_548,pSVar2->_vptr_Server[-2] + (long)&pSVar2->_vptr_Server);
    }
    p_Var15 = local_4e0;
    if (local_4e0 != (_Base_ptr)0x0) {
      local_4e0 = (_Base_ptr)0x0;
      (***(_func_int ***)p_Stack_4e8)
                (p_Stack_4e8,*(long *)(*(long *)p_Var15 + -0x10) + (long)&p_Var15->_M_color);
    }
  }
  if ((local_549 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x30b,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  plVar7 = plStack_4c8;
  if (plStack_4c8 != (long *)0x0) {
    plStack_4c8 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_4d8._12_4_,local_4d8._8_4_))
              ((undefined8 *)CONCAT44(local_4d8._12_4_,local_4d8._8_4_),
               (long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  local_470.exception.ptr._0_4_ = local_470.exception.ptr._0_4_ & 0xffffff00;
  local_310 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_480,&local_470,&local_148.waitScope);
  if (local_310 == '\x01') {
    if ((kj)local_470.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_470.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_470.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_470.exception.ptr.field_1.value,0);
  }
  if ((kj)local_470.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_470.exception.ptr.field_1.value);
  }
  if ((local_549 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x311,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  uVar6 = local_480._8_8_;
  if ((PromiseNode *)local_480._8_8_ != (PromiseNode *)0x0) {
    local_480._8_8_ = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_480._4_4_,local_480._0_4_))
              ((undefined8 *)CONCAT44(local_480._4_4_,local_480._0_4_),
               (*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
  }
  pPVar11 = local_2f8.ptr;
  if (local_2f8.ptr != (PromiseFulfiller<void> *)0x0) {
    local_2f8.ptr = (PromiseFulfiller<void> *)0x0;
    (**(local_2f8.disposer)->_vptr_Disposer)
              (local_2f8.disposer,
               pPVar11->_vptr_PromiseFulfiller[-2] + (long)&pPVar11->_vptr_PromiseFulfiller);
  }
  pPVar10 = local_308.ptr;
  if (local_308.ptr != (PromiseNode *)0x0) {
    local_308.ptr = (PromiseNode *)0x0;
    (**(local_308.disposer)->_vptr_Disposer)
              (local_308.disposer,pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode
              );
  }
  TestContext::~TestContext(&local_148);
  return;
}

Assistant:

TEST(Rpc, RetainAndRelease) {
  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  {
    auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
        .castAs<test::TestMoreStuff>();

    {
      auto request = client.holdRequest();
      request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
      request.send().wait(context.waitScope);
    }

    // Do some other call to add a round trip.
    EXPECT_EQ(1, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Shouldn't be destroyed because it's being held by the server.
    EXPECT_FALSE(destroyed);

    // We can ask it to call the held capability.
    EXPECT_EQ("bar", client.callHeldRequest().send().wait(context.waitScope).getS());

    {
      // We can get the cap back from it.
      auto capCopy = client.getHeldRequest().send().wait(context.waitScope).getCap();

      {
        // And call it, without any network communications.
        uint oldSentCount = context.clientNetwork.getSentCount();
        auto request = capCopy.fooRequest();
        request.setI(123);
        request.setJ(true);
        EXPECT_EQ("foo", request.send().wait(context.waitScope).getX());
        EXPECT_EQ(oldSentCount, context.clientNetwork.getSentCount());
      }

      {
        // We can send another copy of the same cap to another method, and it works.
        auto request = client.callFooRequest();
        request.setCap(capCopy);
        EXPECT_EQ("bar", request.send().wait(context.waitScope).getS());
      }
    }

    // Give some time to settle.
    EXPECT_EQ(5, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(6, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(7, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Can't be destroyed, we haven't released it.
    EXPECT_FALSE(destroyed);
  }

  // We released our client, which should cause the server to be released, which in turn will
  // release the cap pointing back to us.
  destructionPromise.wait(context.waitScope);
  EXPECT_TRUE(destroyed);
}